

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> * __thiscall
spvtools::val::ValidationState_t::EntryPointReferences
          (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
           *__return_storage_ptr__,ValidationState_t *this,uint32_t id)

{
  _Rb_tree_header *p_Var1;
  Instruction *pIVar2;
  pointer ppVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  pointer ppVar4;
  Instruction *inst;
  vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
  stack;
  vector<unsigned_int,_std::allocator<unsigned_int>_> function_entry_points;
  Instruction *local_70;
  _Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
  local_68;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70 = FindDef(this,id);
  if (local_70 != (Instruction *)0x0) {
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
    ::push_back((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                 *)&local_68,&local_70);
    while (local_68._M_impl.super__Vector_impl_data._M_start !=
           local_68._M_impl.super__Vector_impl_data._M_finish) {
      pIVar2 = local_68._M_impl.super__Vector_impl_data._M_finish[-1];
      local_68._M_impl.super__Vector_impl_data._M_finish =
           local_68._M_impl.super__Vector_impl_data._M_finish + -1;
      if (pIVar2->function_ == (Function *)0x0) {
        ppVar3 = (pIVar2->uses_).
                 super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (ppVar4 = (pIVar2->uses_).
                      super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar3;
            ppVar4 = ppVar4 + 1) {
          local_48._M_impl.super__Vector_impl_data._M_start = (pointer)ppVar4->first;
          std::
          vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
          ::push_back((vector<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
                       *)&local_68,(value_type *)&local_48);
        }
      }
      else {
        __x = FunctionEntryPoints(this,pIVar2->function_->id_);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,__x);
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::
        _M_insert_range_unique<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                    *)__return_storage_ptr__,
                   (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )local_48._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )local_48._M_impl.super__Vector_impl_data._M_finish);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
      }
    }
    std::
    _Vector_base<const_spvtools::val::Instruction_*,_std::allocator<const_spvtools::val::Instruction_*>_>
    ::~_Vector_base(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<uint32_t> ValidationState_t::EntryPointReferences(uint32_t id) const {
  std::set<uint32_t> referenced_entry_points;
  const auto inst = FindDef(id);
  if (!inst) return referenced_entry_points;

  std::vector<const Instruction*> stack;
  stack.push_back(inst);
  while (!stack.empty()) {
    const auto current_inst = stack.back();
    stack.pop_back();

    if (const auto func = current_inst->function()) {
      // Instruction lives in a function, we can stop searching.
      const auto function_entry_points = FunctionEntryPoints(func->id());
      referenced_entry_points.insert(function_entry_points.begin(),
                                     function_entry_points.end());
    } else {
      // Instruction is in the global scope, keep searching its uses.
      for (auto pair : current_inst->uses()) {
        const auto next_inst = pair.first;
        stack.push_back(next_inst);
      }
    }
  }

  return referenced_entry_points;
}